

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::RgbaInputFile::readPixels(RgbaInputFile *this,int scanLine1,int scanLine2)

{
  Lock local_28;
  
  local_28._mutex = &this->_fromYca->super_Mutex;
  if ((FromYca *)local_28._mutex != (FromYca *)0x0) {
    std::mutex::lock(local_28._mutex);
    local_28._locked = true;
    FromYca::readPixels(this->_fromYca,scanLine1,scanLine2);
    IlmThread_2_5::Lock::~Lock(&local_28);
    return;
  }
  InputFile::readPixels(this->_inputFile,scanLine1,scanLine2);
  return;
}

Assistant:

void	
RgbaInputFile::readPixels (int scanLine1, int scanLine2)
{
    if (_fromYca)
    {
	Lock lock (*_fromYca);
	_fromYca->readPixels (scanLine1, scanLine2);
    }
    else
    {
	_inputFile->readPixels (scanLine1, scanLine2);
    }
}